

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode Curl_setup_conn(connectdata *conn,_Bool *protocol_done)

{
  Curl_easy *data;
  CURLcode CVar1;
  char *pcVar2;
  curltime cVar3;
  
  data = conn->data;
  Curl_pgrsTime(data,TIMER_NAMELOOKUP);
  if ((conn->handler->flags & 0x10) == 0) {
    *protocol_done = false;
    (conn->bits).proxy_connect_closed = false;
    if ((data->set).str[0x26] != (char *)0x0) {
      (*Curl_cfree)((conn->allocptr).uagent);
      (conn->allocptr).uagent = (char *)0x0;
      pcVar2 = curl_maprintf("User-Agent: %s\r\n",(data->set).str[0x26]);
      (conn->allocptr).uagent = pcVar2;
      if (pcVar2 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    (data->req).headerbytecount = 0;
    (data->state).crlf_conversions = 0;
    cVar3 = Curl_now();
    (conn->now).tv_sec = cVar3.tv_sec;
    (conn->now).tv_usec = cVar3.tv_usec;
    if (conn->sock[0] == -1) {
      (conn->bits).tcpconnect[0] = false;
      CVar1 = Curl_connecthost(conn,conn->dns_entry);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    }
    else {
      Curl_pgrsTime(data,TIMER_CONNECT);
      Curl_pgrsTime(data,TIMER_APPCONNECT);
      (conn->bits).tcpconnect[0] = true;
      *protocol_done = true;
      Curl_updateconninfo(conn,conn->sock[0]);
      Curl_verboseconnect(conn);
    }
    cVar3 = Curl_now();
    (conn->now).tv_sec = cVar3.tv_sec;
    (conn->now).tv_usec = cVar3.tv_usec;
  }
  else {
    *protocol_done = true;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_setup_conn(struct connectdata *conn,
                         bool *protocol_done)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  Curl_pgrsTime(data, TIMER_NAMELOOKUP);

  if(conn->handler->flags & PROTOPT_NONETWORK) {
    /* nothing to setup when not using a network */
    *protocol_done = TRUE;
    return result;
  }
  *protocol_done = FALSE; /* default to not done */

  /* set proxy_connect_closed to false unconditionally already here since it
     is used strictly to provide extra information to a parent function in the
     case of proxy CONNECT failures and we must make sure we don't have it
     lingering set from a previous invoke */
  conn->bits.proxy_connect_closed = FALSE;

  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through a http proxy we can't limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(conn->allocptr.uagent);
    conn->allocptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!conn->allocptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  data->req.headerbytecount = 0;

#ifdef CURL_DO_LINEEND_CONV
  data->state.crlf_conversions = 0; /* reset CRLF conversion counter */
#endif /* CURL_DO_LINEEND_CONV */

  /* set start time here for timeout purposes in the connect procedure, it
     is later set again for the progress meter purpose */
  conn->now = Curl_now();

  if(CURL_SOCKET_BAD == conn->sock[FIRSTSOCKET]) {
    conn->bits.tcpconnect[FIRSTSOCKET] = FALSE;
    result = Curl_connecthost(conn, conn->dns_entry);
    if(result)
      return result;
  }
  else {
    Curl_pgrsTime(data, TIMER_CONNECT);    /* we're connected already */
    Curl_pgrsTime(data, TIMER_APPCONNECT); /* we're connected already */
    conn->bits.tcpconnect[FIRSTSOCKET] = TRUE;
    *protocol_done = TRUE;
    Curl_updateconninfo(conn, conn->sock[FIRSTSOCKET]);
    Curl_verboseconnect(conn);
  }

  conn->now = Curl_now(); /* time this *after* the connect is done, we set
                             this here perhaps a second time */
  return result;
}